

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

bool __thiscall
TFileNameDatabase::CompareAndCopyPathFragmentByIndex
          (TFileNameDatabase *this,TMndxSearch *pSearch,DWORD TableIndex)

{
  uint TableIndex_00;
  TStruct40 *pTVar1;
  bool bVar2;
  DWORD DVar3;
  _HASH_ENTRY *p_Var4;
  byte *pbVar5;
  uchar *puVar6;
  ulong index;
  
  pTVar1 = pSearch->pStruct40;
  do {
    p_Var4 = TGenericArray<_HASH_ENTRY>::operator[]
                       (&this->HashTable,(ulong)(this->HashTableMask & TableIndex));
    if (TableIndex == p_Var4->NextIndex) {
      TableIndex_00 = (p_Var4->field_2).FragmentOffset;
      if (TableIndex_00 >> 8 < 0xffffff) {
        if (this->pChildDB == (TFileNameDatabase *)0x0) {
          bVar2 = TPathFragmentTable::CompareAndCopyPathFragment
                            (&this->PathFragmentTable,pSearch,(ulong)TableIndex_00);
        }
        else {
          bVar2 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,TableIndex_00);
        }
        if (bVar2 == false) {
          return false;
        }
      }
      else {
        if (pSearch->szSearchMask[pTVar1->PathLength] != (char)TableIndex_00) {
          return false;
        }
        TGenericArray<char>::Insert(&pTVar1->PathBuffer,(char)TableIndex_00);
        pTVar1->PathLength = pTVar1->PathLength + 1;
      }
      TableIndex = p_Var4->NodeIndex;
      if (TableIndex == 0) {
        return true;
      }
    }
    else {
      index = (ulong)TableIndex;
      bVar2 = TSparseArray::IsItemPresent(&this->CollisionHiBitsIndexes,index);
      if (bVar2) {
        DVar3 = GetPathFragmentOffset1(this,TableIndex);
        if (this->pChildDB == (TFileNameDatabase *)0x0) {
          bVar2 = TPathFragmentTable::CompareAndCopyPathFragment
                            (&this->PathFragmentTable,pSearch,(ulong)DVar3);
        }
        else {
          bVar2 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,DVar3);
        }
        if (bVar2 == false) {
          return false;
        }
      }
      else {
        pbVar5 = TGenericArray<unsigned_char>::operator[](&this->LoBitsTable,index);
        if ((uint)*pbVar5 != (int)pSearch->szSearchMask[pTVar1->PathLength]) {
          return false;
        }
        puVar6 = TGenericArray<unsigned_char>::operator[](&this->LoBitsTable,index);
        TGenericArray<char>::Insert(&pTVar1->PathBuffer,*puVar6);
        pTVar1->PathLength = pTVar1->PathLength + 1;
      }
      if (TableIndex <= this->field_214) {
        return true;
      }
      DVar3 = TSparseArray::GetItem1(&this->CollisionTable,TableIndex);
      TableIndex = DVar3 + ~TableIndex;
    }
    if (pSearch->cchSearchMask <= (ulong)pTVar1->PathLength) {
      CopyPathFragmentByIndex(this,pSearch,TableIndex);
      return true;
    }
  } while( true );
}

Assistant:

bool CompareAndCopyPathFragmentByIndex(TMndxSearch * pSearch, DWORD TableIndex)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;
        PHASH_ENTRY pHashEntry;

        // HOTS: 1959024
        for(;;)
        {
            pHashEntry = &HashTable[TableIndex & HashTableMask];
            if(TableIndex == pHashEntry->NextIndex)
            {
                // HOTS: 1959047
                if(!IsPathFragmentSingleChar(pHashEntry))
                {
                    // HOTS: 195905A
                    if(pChildDB != NULL)
                    {
                        if(!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, pHashEntry->ChildTableIndex))
                            return false;
                    }
                    else
                    {
                        if(!PathFragmentTable.CompareAndCopyPathFragment(pSearch, pHashEntry->FragmentOffset))
                            return false;
                    }
                }
                else
                {
                    // HOTS: 1959092
                    if(pHashEntry->SingleChar != pSearch->szSearchMask[pStruct40->PathLength])
                        return false;

                    // Insert the low 8 bits to the path being built
                    pStruct40->PathBuffer.Insert(pHashEntry->SingleChar);
                    pStruct40->PathLength++;
                }

                // HOTS: 195912E
                TableIndex = pHashEntry->NodeIndex;
                if(TableIndex == 0)
                    return true;
            }
            else
            {
                // HOTS: 1959147
                if(IsPathFragmentString(TableIndex))
                {
                    // HOTS: 195917C
                    DWORD FragmentOffset = GetPathFragmentOffset1(TableIndex);

                    if(pChildDB != NULL)
                    {
                        if(!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, FragmentOffset))
                            return false;
                    }
                    else
                    {
                        if(!PathFragmentTable.CompareAndCopyPathFragment(pSearch, FragmentOffset))
                            return false;
                    }
                }
                else
                {
                    // HOTS: 195920E
                    if(LoBitsTable[TableIndex] != pSearch->szSearchMask[pStruct40->PathLength])
                        return false;

                    // Insert one character to the path being built
                    pStruct40->PathBuffer.Insert(LoBitsTable[TableIndex]);
                    pStruct40->PathLength++;
                }

                // HOTS: 19592B6
                if(TableIndex <= field_214)
                    return true;

                TableIndex = 0xFFFFFFFF - TableIndex + CollisionTable.GetItem1(TableIndex);
            }

            // HOTS: 19592D5
            if(pStruct40->PathLength >= pSearch->cchSearchMask)
                break;
        }

        CopyPathFragmentByIndex(pSearch, TableIndex);
        return true;
    }